

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

bool extractLine(string *line,string *text,int width,bool hyphenate,uint *offset,char surrogate)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  string local_1b8 [32];
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  int local_88;
  int local_84;
  int last_character;
  int last_last_character;
  int local_60;
  int local_5c;
  int line_width;
  int char_width;
  int character;
  uint last_ws;
  size_type bytes;
  size_type last_bytes;
  size_type last_last_bytes;
  uint *puStack_30;
  char surrogate_local;
  uint *offset_local;
  bool hyphenate_local;
  string *psStack_20;
  int width_local;
  string *text_local;
  string *line_local;
  
  uVar1 = *offset;
  last_last_bytes._7_1_ = surrogate;
  puStack_30 = offset;
  offset_local._3_1_ = hyphenate;
  offset_local._4_4_ = width;
  psStack_20 = text;
  text_local = line;
  uVar2 = std::__cxx11::string::length();
  if (uVar1 < uVar2) {
    bytes = (size_type)*puStack_30;
    _character = (ulong)*puStack_30;
    char_width = 0;
    local_5c = 0;
    local_60 = 0;
    while( true ) {
      last_bytes = bytes;
      bytes = _character;
      line_width = utf8_next_char(psStack_20,(size_type *)&character);
      if ((line_width == L'\0') || (line_width == L'\n')) break;
      if (line_width == L' ') {
        char_width = (int)bytes;
      }
      local_5c = mk_wcwidth(line_width);
      if (offset_local._4_4_ < local_60 + local_5c) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_20);
        local_84 = (int)*pcVar3;
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_20);
        local_88 = (int)*pcVar3;
        if ((local_84 != 0x20) && (local_88 == 0x20)) {
          std::__cxx11::string::substr((ulong)local_a8,(ulong)psStack_20);
          std::__cxx11::string::operator=((string *)text_local,local_a8);
          std::__cxx11::string::~string(local_a8);
          *puStack_30 = (int)bytes + 1;
          goto LAB_00123cf5;
        }
        if (((local_84 == 0x20) && (local_88 != 0x20)) && (char_width != 0)) {
          std::__cxx11::string::substr((ulong)local_c8,(ulong)psStack_20);
          std::__cxx11::string::operator=((string *)text_local,local_c8);
          std::__cxx11::string::~string(local_c8);
          *puStack_30 = (uint)bytes;
          goto LAB_00123cf5;
        }
        if ((local_84 != 0x20) && (local_88 != 0x20)) {
          if (char_width == 0) {
            if ((offset_local._4_4_ < local_5c) && (bytes == *puStack_30)) {
              std::__cxx11::string::operator=((string *)text_local,last_last_bytes._7_1_);
              *puStack_30 = (uint)_character;
            }
            else if ((offset_local._3_1_ & 1) == 0) {
              std::__cxx11::string::substr((ulong)local_1b8,(ulong)psStack_20);
              std::__cxx11::string::operator=((string *)text_local,local_1b8);
              std::__cxx11::string::~string(local_1b8);
              *puStack_30 = (uint)bytes;
            }
            else if (offset_local._4_4_ < local_60 + 1) {
              if (last_bytes == *puStack_30) {
                std::__cxx11::string::substr((ulong)local_198,(ulong)psStack_20);
                std::__cxx11::string::operator=((string *)text_local,local_198);
                std::__cxx11::string::~string(local_198);
                *puStack_30 = (uint)bytes;
              }
              else {
                std::__cxx11::string::substr((ulong)&local_178,(ulong)psStack_20);
                std::operator+(&local_158,&local_178,'-');
                std::__cxx11::string::operator=((string *)text_local,(string *)&local_158);
                std::__cxx11::string::~string((string *)&local_158);
                std::__cxx11::string::~string((string *)&local_178);
                *puStack_30 = (uint)last_bytes;
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&local_128,(ulong)psStack_20);
              std::operator+(&local_108,&local_128,'-');
              std::__cxx11::string::operator=((string *)text_local,(string *)&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_128);
              *puStack_30 = (uint)bytes;
            }
          }
          else {
            std::__cxx11::string::substr((ulong)local_e8,(ulong)psStack_20);
            std::__cxx11::string::operator=((string *)text_local,local_e8);
            std::__cxx11::string::~string(local_e8);
            *puStack_30 = char_width + 1;
          }
          goto LAB_00123cf5;
        }
      }
      local_60 = local_5c + local_60;
    }
    std::__cxx11::string::substr((ulong)&last_character,(ulong)psStack_20);
    std::__cxx11::string::operator=((string *)text_local,(string *)&last_character);
    std::__cxx11::string::~string((string *)&last_character);
    *puStack_30 = (uint)_character;
LAB_00123cf5:
    line_local._7_1_ = true;
  }
  else {
    line_local._7_1_ = false;
  }
  return line_local._7_1_;
}

Assistant:

bool extractLine (
  std::string& line,
  const std::string& text,
  int width,
  bool hyphenate,
  unsigned int& offset,
  char surrogate)
{
  // Terminate processing.
  // Note: bytes vs bytes.
  if (offset >= text.length ())
    return false;

  std::string::size_type last_last_bytes = offset;
  std::string::size_type last_bytes = offset;
  std::string::size_type bytes = offset;
  unsigned int last_ws = 0;
  int character;
  int char_width = 0;
  int line_width = 0;
  while (1)
  {
    last_last_bytes = last_bytes;
    last_bytes = bytes;
    character = utf8_next_char (text, bytes);

    if (character == 0 ||
        character == '\n')
    {
      line = text.substr (offset, last_bytes - offset);
      offset = bytes;
      break;
    }
    else if (character == ' ')
      last_ws = last_bytes;

    char_width = mk_wcwidth (character);
    if (line_width + char_width > width)
    {
      int last_last_character = text[last_last_bytes];
      int last_character = text[last_bytes];

      // [case 1] one| two --> last_last != 32, last == 32, ws == 0
      if (last_last_character != ' ' &&
          last_character      == ' ')
      {
        line = text.substr (offset, last_bytes - offset);
        offset = last_bytes + 1;
        break;
      }

      // [case 2] one |two --> last_last == 32, last != 32, ws != 0
      else if (last_last_character == ' ' &&
               last_character      != ' ' &&
               last_ws             != 0)
      {
        line = text.substr (offset, last_bytes - offset - 1);
        offset = last_bytes;
        break;
      }

      else if (last_last_character != ' ' &&
               last_character      != ' ')
      {
        // [case 3] one t|wo --> last_last != 32, last != 32, ws != 0
        if (last_ws != 0)
        {
          line = text.substr (offset, last_ws - offset);
          offset = last_ws + 1;
          break;
        }
        // [case 4] on|e two --> last_last != 32, last != 32, ws == 0
        else
        {
          if (char_width > width && last_bytes == offset)
          {
            // the first character is already too wide,
            // no other way to split the line but to replace the character
            // with a surrogate
            line = surrogate;
            offset = bytes;
          }
          else
          {
            if (hyphenate)
            {
              if (line_width + 1 <= width)
              {
                // if the last good part + hyphen is short enough,
                // i.e. the just read character is wider than one column
                line = text.substr (offset, last_bytes - offset) + '-';
                offset = last_bytes;
              }
              else if (last_last_bytes - offset > 0)
              {
                // sacrifice last character from the last good part,
                // but only if there is at least one character left
                line = text.substr (offset, last_last_bytes - offset) + '-';
                offset = last_last_bytes;
              }
              else
              {
                // no other way to split the line but to omit the hyphen
                line = text.substr (offset, last_bytes - offset);
                offset = last_bytes;
              }
            }
            else
            {
              // just use the last good part
              line = text.substr (offset, last_bytes - offset);
              offset = last_bytes;
            }
          }
        }

        break;
      }
    }

    line_width += char_width;
  }

  return true;
}